

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.cpp
# Opt level: O3

void R_InitSkins(void)

{
  ulong uVar1;
  FPlayerSkin *__dest;
  uint *puVar2;
  PClassPlayerPawn *pPVar3;
  anon_union_8_2_86621bee_for_spritedef_t_0 aVar4;
  bool bVar5;
  spritedef_t *psVar6;
  FPlayerClass *pFVar7;
  spritedef_t *psVar8;
  char *pcVar9;
  uint uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  FTextureID lump;
  PClass *pPVar16;
  PClassActor *pPVar17;
  PClassPlayerPawn *pPVar18;
  bool bVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  bool bVar23;
  uint uVar24;
  FPlayerSkin *pFVar25;
  PClassPlayerPawn *pPVar26;
  int *piVar27;
  double dVar28;
  double dVar29;
  int maxframe;
  int lastlump;
  char lname [9];
  spritedef_t temp;
  FSoundID playersoundrefs [17];
  int sndlumps [17];
  char key [65];
  FScanner sc;
  char name [9];
  int local_b8c;
  PClassPlayerPawn *local_b88;
  int local_b78 [4];
  char local_b68;
  char local_b67;
  char local_b66;
  char local_b65;
  ulong local_b60;
  undefined4 local_b54;
  uint uStack_b50;
  undefined4 local_b4c;
  long local_b48;
  undefined8 local_b40;
  undefined1 local_b38 [16];
  undefined1 local_b28 [16];
  undefined1 local_b18 [16];
  undefined1 local_b08 [16];
  undefined4 local_af8;
  int aiStack_aec [21];
  char local_a98 [64];
  undefined1 local_a58;
  FScanner local_a48;
  spriteframewithrotate local_948 [29];
  
  lVar20 = 0;
  local_af8 = 0;
  local_b08 = (undefined1  [16])0x0;
  local_b18 = (undefined1  [16])0x0;
  local_b28 = (undefined1  [16])0x0;
  local_b38 = (undefined1  [16])0x0;
  local_a58 = 0;
  uVar24 = PlayerClasses.Count - 1;
  local_b78[1] = 0;
  do {
    iVar12 = S_FindSound(*(char **)((long)skinsoundnames[0] + lVar20 * 4 + 8));
    *(int *)(local_b38 + lVar20) = iVar12;
    lVar20 = lVar20 + 4;
    local_b60 = (ulong)uVar24;
  } while (lVar20 != 0x44);
  do {
    do {
      iVar12 = FWadCollection::FindLump(&Wads,"S_SKIN",local_b78 + 1,true);
      if (iVar12 == -1) {
        if (PlayerClasses.Count < numskins) {
          S_HashSounds();
          S_ShrinkPlayerSoundLists();
        }
        return;
      }
      iVar13 = FWadCollection::GetNumLumps(&Wads);
      uVar22 = local_b60;
    } while (iVar13 + -0x17 <= iVar12);
    aiStack_aec[0xd] = 0xffffffff;
    aiStack_aec[0xe] = 0xffffffff;
    aiStack_aec[0xf] = 0xffffffff;
    aiStack_aec[0x10] = 0xffffffff;
    aiStack_aec[9] = 0xffffffff;
    aiStack_aec[10] = 0xffffffff;
    aiStack_aec[0xb] = 0xffffffff;
    aiStack_aec[0xc] = 0xffffffff;
    aiStack_aec[5] = 0xffffffff;
    aiStack_aec[6] = 0xffffffff;
    aiStack_aec[7] = 0xffffffff;
    aiStack_aec[8] = 0xffffffff;
    aiStack_aec[1] = 0xffffffff;
    aiStack_aec[2] = 0xffffffff;
    aiStack_aec[3] = 0xffffffff;
    aiStack_aec[4] = 0xffffffff;
    aiStack_aec[0x11] = 0xffffffff;
    uVar1 = local_b60 + 1;
    iVar13 = FWadCollection::GetLumpNamespace(&Wads,iVar12);
    skins[uVar1].namespc = iVar13;
    FScanner::FScanner(&local_a48,iVar12);
    local_b48 = uVar22 * 0x40;
    local_b40 = local_b48 + 0x53;
    local_b88 = (PClassPlayerPawn *)0x0;
    pPVar18 = (PClassPlayerPawn *)0x0;
    bVar19 = false;
    local_b78[2] = 0;
    local_b8c = 0;
LAB_0051408e:
    bVar11 = FScanner::GetString(&local_a48);
    if (!bVar11) goto LAB_005146fc;
    strncpy(local_a98,local_a48.String,0x40);
    bVar11 = FScanner::GetString(&local_a48);
    if ((!bVar11) || (*local_a48.String != '=')) {
      Printf(200,"Bad format for skin %d: %s\n",uVar1);
      goto LAB_005146fc;
    }
    FScanner::GetString(&local_a48);
    iVar13 = strcasecmp(local_a98,"name");
    pFVar25 = skins;
    if (iVar13 == 0) {
      __dest = skins + uVar1;
      strncpy(__dest->name,local_a48.String,0x10);
      if (uVar1 != 0) {
        lVar20 = 0;
        uVar22 = uVar1;
        do {
          iVar13 = strcasecmp(__dest->name,pFVar25->name);
          if (iVar13 == 0) {
            mysnprintf(__dest->name,0x11,"skin%d",uVar1);
            Printf(200,"Skin %s duplicated as %s\n",(long)skins - lVar20);
            break;
          }
          lVar20 = lVar20 + -0x40;
          pFVar25 = pFVar25 + 1;
          uVar22 = uVar22 - 1;
        } while (uVar22 != 0);
      }
      goto LAB_0051408e;
    }
    iVar13 = strcasecmp(local_a98,"sprite");
    if (iVar13 == 0) {
      lVar20 = 3;
      do {
        pcVar9 = local_a48.String;
        iVar13 = toupper((int)*(char *)((long)local_a48.String + lVar20));
        *(char *)((long)pcVar9 + lVar20) = (char)iVar13;
        bVar11 = lVar20 != 0;
        lVar20 = lVar20 + -1;
      } while (bVar11);
      local_b8c = *(int *)local_a48.String;
      goto LAB_0051408e;
    }
    iVar13 = strcasecmp(local_a98,"crouchsprite");
    if (iVar13 == 0) {
      lVar20 = 3;
      do {
        pcVar9 = local_a48.String;
        iVar13 = toupper((int)*(char *)((long)local_a48.String + lVar20));
        *(char *)((long)pcVar9 + lVar20) = (char)iVar13;
        bVar11 = lVar20 != 0;
        lVar20 = lVar20 + -1;
      } while (bVar11);
      local_b78[2] = *(int *)local_a48.String;
      goto LAB_0051408e;
    }
    iVar13 = strcasecmp(local_a98,"face");
    lVar20 = local_b40;
    if (iVar13 == 0) {
      lVar21 = 0;
      do {
        iVar13 = toupper((int)*(char *)((long)local_a48.String + lVar21 + 2));
        skins->name[lVar21 + lVar20] = (char)iVar13;
        lVar21 = lVar21 + -1;
      } while (lVar21 != -3);
      skins[uVar1].face[3] = '\0';
      goto LAB_0051408e;
    }
    iVar13 = strcasecmp(local_a98,"gender");
    if (iVar13 == 0) {
      iVar13 = D_GenderToInt(local_a48.String);
      skins[uVar1].gender = (BYTE)iVar13;
      goto LAB_0051408e;
    }
    iVar13 = strcasecmp(local_a98,"scale");
    if (iVar13 == 0) {
      dVar28 = atof(local_a48.String);
      pFVar25 = skins;
      dVar29 = 256.0;
      if (dVar28 <= 256.0) {
        dVar29 = dVar28;
      }
      dVar29 = (double)(~-(ulong)(1.52587890625e-05 < dVar28) & 0x3ef0000000000000 |
                       (ulong)dVar29 & -(ulong)(1.52587890625e-05 < dVar28));
      skins[uVar1].Scale.X = dVar29;
      pFVar25[uVar1].Scale.Y = dVar29;
      goto LAB_0051408e;
    }
    iVar13 = strcasecmp(local_a98,"game");
    if (iVar13 != 0) {
      iVar13 = strcasecmp(local_a98,"class");
      if (iVar13 == 0) {
        uVar24 = D_PlayerClassToInt(local_a48.String);
        if ((int)uVar24 < 0) goto LAB_00514b41;
        pPVar18 = PlayerClasses.Array[uVar24].Type;
        local_b88 = pPVar18;
      }
      else if (local_a98[0] == '*') {
        iVar13 = FWadCollection::CheckNumForName(&Wads,local_a48.String,skins[uVar1].namespc);
        if ((iVar13 != -1) ||
           (iVar13 = FWadCollection::CheckNumForFullName(&Wads,local_a48.String,true,0xd),
           iVar13 != -1)) {
          iVar14 = strcasecmp(local_a98,"*pain");
          if (iVar14 == 0) {
            iVar13 = S_AddPlayerSound(skins[uVar1].name,(uint)skins[uVar1].gender,local_b38._0_4_,
                                      iVar13,true);
            uVar22 = 4;
            do {
              S_AddPlayerSoundExisting
                        (skins[uVar1].name,(uint)skins[uVar1].gender,
                         *(int *)(local_b38 + uVar22 * 4 + -4),iVar13,true);
              uVar22 = uVar22 - 1;
            } while (1 < uVar22);
          }
          else {
            iVar14 = S_FindSoundNoHash(local_a98);
            if (iVar14 != 0) {
              S_AddPlayerSound(skins[uVar1].name,(uint)skins[uVar1].gender,iVar14,iVar13,true);
            }
          }
        }
      }
      else {
        lVar20 = 0;
        piVar27 = aiStack_aec;
        do {
          piVar27 = piVar27 + 1;
          iVar13 = strcasecmp(local_a98,*(char **)((long)skinsoundnames[0] + lVar20));
          if (iVar13 == 0) {
            iVar13 = FWadCollection::CheckNumForName(&Wads,local_a48.String,skins[uVar1].namespc);
            *piVar27 = iVar13;
            if (iVar13 == -1) {
              iVar13 = FWadCollection::CheckNumForFullName(&Wads,local_a48.String,true,0xd);
              *piVar27 = iVar13;
            }
          }
          lVar20 = lVar20 + 0x10;
        } while (lVar20 != 0x110);
      }
      goto LAB_0051408e;
    }
    if (gameinfo.gametype == GAME_Strife) {
      local_948[0].super_spriteframe_t.Voxel._0_4_ = 0x50;
      pPVar16 = PClass::FindClass((FName *)local_948);
      pPVar17 = dyn_cast<PClassActor>((DObject *)pPVar16);
    }
    else if (gameinfo.gametype == GAME_Heretic) {
      local_948[0].super_spriteframe_t.Voxel._0_4_ = 0x4f;
      pPVar16 = PClass::FindClass((FName *)local_948);
      pPVar17 = dyn_cast<PClassActor>((DObject *)pPVar16);
    }
    else {
      local_948[0].super_spriteframe_t.Voxel._0_4_ = 0x4e;
      pPVar16 = PClass::FindClass((FName *)local_948);
      pPVar17 = dyn_cast<PClassActor>((DObject *)pPVar16);
    }
    pPVar18 = dyn_cast<PClassPlayerPawn>((DObject *)pPVar17);
    pcVar9 = local_a48.String;
    iVar13 = strcasecmp(local_a48.String,"heretic");
    local_b88 = pPVar18;
    if (iVar13 == 0) {
      if ((gameinfo.gametype & GAME_DoomChex) == GAME_Any) {
        bVar11 = gameinfo.gametype == GAME_Heretic;
        goto LAB_005146b9;
      }
      local_948[0].super_spriteframe_t.Voxel._0_4_ = 0x4f;
      pPVar16 = PClass::FindClass((FName *)local_948);
      pPVar17 = dyn_cast<PClassActor>((DObject *)pPVar16);
      local_b88 = dyn_cast<PClassPlayerPawn>((DObject *)pPVar17);
LAB_00514623:
      skins[uVar1].othergame = true;
    }
    else {
      iVar13 = strcasecmp(pcVar9,"strife");
      if (iVar13 == 0) {
        bVar11 = gameinfo.gametype == GAME_Strife;
LAB_005146b9:
        if (!bVar11) {
          bVar19 = true;
        }
      }
      else {
        if (gameinfo.gametype == GAME_Heretic) {
          local_948[0].super_spriteframe_t.Voxel._0_4_ = 0x4e;
          pPVar16 = PClass::FindClass((FName *)local_948);
          pPVar17 = dyn_cast<PClassActor>((DObject *)pPVar16);
          local_b88 = dyn_cast<PClassPlayerPawn>((DObject *)pPVar17);
          goto LAB_00514623;
        }
        if ((gameinfo.gametype & GAME_DoomChex) == GAME_Any) {
          bVar19 = true;
        }
      }
    }
    if (!bVar19) goto LAB_0051408e;
LAB_005146fc:
    if ((bVar19) || (pPVar18 != (PClassPlayerPawn *)0x0)) {
LAB_005147c4:
      pFVar25 = skins;
      if (!bVar19) {
        skins[uVar1].range0start = local_b88->ColorRangeStart;
        pFVar25[uVar1].range0end = local_b88->ColorRangeEnd;
        if ((int)PlayerClasses.Count < 1) goto LAB_00514b41;
        bVar19 = true;
        lVar20 = 0;
        uVar24 = PlayerClasses.Count;
        do {
          pFVar7 = PlayerClasses.Array;
          pPVar3 = PlayerClasses.Array[lVar20].Type;
          pPVar26 = pPVar3;
          if (pPVar3 == pPVar18) {
LAB_00514834:
            if (((*(int *)(*(long *)((pPVar3->super_PClassActor).super_PClass.Defaults + 0x448) +
                          0x10) ==
                  *(int *)(*(long *)((pPVar18->super_PClassActor).super_PClass.Defaults + 0x448) +
                          0x10)) && (pPVar3->ColorRangeStart == pPVar18->ColorRangeStart)) &&
               (pPVar3->ColorRangeEnd == pPVar18->ColorRangeEnd)) {
              TArray<int,_int>::Grow(&PlayerClasses.Array[lVar20].Skins,1);
              pFVar7[lVar20].Skins.Array[pFVar7[lVar20].Skins.Count] = (int)uVar1;
              puVar2 = &pFVar7[lVar20].Skins.Count;
              *puVar2 = *puVar2 + 1;
              bVar19 = false;
              uVar24 = PlayerClasses.Count;
            }
          }
          else {
            do {
              pPVar26 = (PClassPlayerPawn *)(pPVar26->super_PClassActor).super_PClass.ParentClass;
              if (pPVar26 == pPVar18) break;
            } while (pPVar26 != (PClassPlayerPawn *)0x0);
            if (pPVar26 != (PClassPlayerPawn *)0x0) goto LAB_00514834;
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < (int)uVar24);
      }
      if (!bVar19) {
        if (skins[uVar1].name[0] == '\0') {
          mysnprintf(skins[uVar1].name,0x11,"skin%d");
        }
        if (local_b8c == 0) {
          FWadCollection::GetLumpName(&Wads,(char *)local_948,iVar12 + 1);
          local_b8c = (int)local_948[0].super_spriteframe_t.Voxel;
        }
        iVar13 = FWadCollection::GetLumpNamespace(&Wads,iVar12);
        iVar12 = iVar12 + 1;
        bVar23 = false;
        bVar11 = true;
        do {
          bVar5 = bVar11;
          memset(local_948,0xff,0x910);
          lVar20 = 0;
          do {
            *(undefined2 *)((long)(local_948[0].super_spriteframe_t.Texture + 0x10) + lVar20) = 0;
            *(undefined8 *)
             ((long)&((spriteframe_t *)(local_948[0].super_spriteframe_t.Texture + -2))->Voxel +
             lVar20) = 0;
            lVar20 = lVar20 + 0x50;
          } while (lVar20 != 0x910);
          local_b78[0] = -1;
          iVar14 = iVar12;
          if ((bVar23) &&
             ((local_b78[2] == 0 ||
              (bVar11 = local_b78[2] == local_b8c, local_b8c = local_b78[2], bVar11)))) {
            skins[uVar1].crouchsprite = -1;
            break;
          }
          while (iVar15 = FWadCollection::GetLumpNamespace(&Wads,iVar14), iVar15 == iVar13) {
            FWadCollection::GetLumpName(&Wads,(char *)(local_b78 + 3),iVar14);
            if (local_b78[3] == local_b8c) {
              lump = FTextureManager::CreateTexture(&TexMan,iVar14,6);
              bVar11 = R_InstallSpriteLump(lump,(int)local_b68 - 0x41,local_b67,false,local_948,
                                           local_b78);
              if (bVar11 && local_b66 != '\0') {
                R_InstallSpriteLump(lump,(int)local_b66 - 0x41,local_b65,true,local_948,local_b78);
              }
            }
            iVar14 = iVar14 + 1;
          }
          if ((bool)(local_b78[0] < 1 & bVar5)) {
            bVar19 = true;
            Printf(200,"Skin %s (#%d) has no frames. Removing.\n",skins + uVar1,uVar1);
            break;
          }
          FWadCollection::GetLumpName(&Wads,(char *)&local_b54,iVar12);
          uStack_b50 = uStack_b50 & 0xffffff00;
          TArray<spritedef_t,_spritedef_t>::Grow(&sprites,1);
          psVar8 = sprites.Array;
          uVar22 = (ulong)sprites.Count;
          psVar6 = sprites.Array + uVar22;
          psVar6->numframes = (undefined1)local_b4c;
          psVar6->field_0x9 = local_b4c._1_1_;
          psVar6->spriteframes = local_b4c._2_2_;
          aVar4._4_4_ = uStack_b50;
          aVar4.dwName = local_b54;
          psVar8[uVar22].field_0 = aVar4;
          uVar24 = sprites.Count;
          if (bVar5) {
            uVar10 = sprites.Count + 1;
            skins[uVar1].sprite = sprites.Count;
            sprites.Count = uVar10;
          }
          else {
            uVar10 = sprites.Count + 1;
            skins[uVar1].crouchsprite = sprites.Count;
            sprites.Count = uVar10;
          }
          R_InstallSprite(uVar24,local_948,local_b78);
          bVar23 = true;
          bVar11 = false;
        } while (bVar5);
      }
      if (bVar19) goto LAB_00514b41;
      lVar20 = 0;
      iVar12 = 0;
      do {
        iVar13 = aiStack_aec[lVar20 + 1];
        if (iVar13 != -1) {
          if ((lVar20 == 0) || (iVar13 != aiStack_aec[lVar20])) {
            iVar12 = S_AddPlayerSound(skins[uVar1].name,(uint)skins[uVar1].gender,
                                      *(int *)(local_b38 + lVar20 * 4),iVar13,true);
          }
          else {
            S_AddPlayerSoundExisting
                      (skins[uVar1].name,(uint)skins[uVar1].gender,*(int *)(local_b38 + lVar20 * 4),
                       iVar12,true);
          }
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x11);
      uVar22 = uVar1;
      if ((skins[uVar1].face[1] == '\0') || (skins[uVar1].face[2] == '\0')) {
        skins[uVar1].face[0] = '\0';
      }
    }
    else {
      if ((gameinfo.gametype & GAME_DoomChex) != GAME_Any) {
        local_948[0].super_spriteframe_t.Voxel._0_4_ = 0x4e;
        pPVar16 = PClass::FindClass((FName *)local_948);
        pPVar17 = dyn_cast<PClassActor>((DObject *)pPVar16);
        pPVar18 = dyn_cast<PClassPlayerPawn>((DObject *)pPVar17);
        local_b88 = pPVar18;
        goto LAB_005147c4;
      }
      if (gameinfo.gametype == GAME_Heretic) {
        local_948[0].super_spriteframe_t.Voxel._0_4_ = 0x4f;
        pPVar16 = PClass::FindClass((FName *)local_948);
        pPVar17 = dyn_cast<PClassActor>((DObject *)pPVar16);
        pPVar18 = dyn_cast<PClassPlayerPawn>((DObject *)pPVar17);
        local_948[0].super_spriteframe_t.Voxel._0_4_ = 0x4e;
        pPVar16 = PClass::FindClass((FName *)local_948);
        pPVar17 = dyn_cast<PClassActor>((DObject *)pPVar16);
        local_b88 = dyn_cast<PClassPlayerPawn>((DObject *)pPVar17);
        skins[uVar1].othergame = true;
        goto LAB_005147c4;
      }
LAB_00514b41:
      uVar22 = local_b60;
      if (uVar1 < numskins - 1) {
        memmove(skins + uVar1,skins[2].name + local_b48,(numskins - local_b60) * 0x40 - 0x80);
      }
    }
    FScanner::~FScanner(&local_a48);
    local_b60 = uVar22;
  } while( true );
}

Assistant:

void R_InitSkins (void)
{
	FSoundID playersoundrefs[NUMSKINSOUNDS];
	spritedef_t temp;
	int sndlumps[NUMSKINSOUNDS];
	char key[65];
	DWORD intname, crouchname;
	size_t i;
	int j, k, base;
	int lastlump;
	int aliasid;
	bool remove;
	PClassPlayerPawn *basetype, *transtype;

	key[sizeof(key)-1] = 0;
	i = PlayerClasses.Size () - 1;
	lastlump = 0;

	for (j = 0; j < NUMSKINSOUNDS; ++j)
	{
		playersoundrefs[j] = skinsoundnames[j][1];
	}

	while ((base = Wads.FindLump ("S_SKIN", &lastlump, true)) != -1)
	{
		// The player sprite has 23 frames. This means that the S_SKIN
		// marker needs a minimum of 23 lumps after it.
		if (base >= Wads.GetNumLumps() - 23 || base == -1)
			continue;

		i++;
		for (j = 0; j < NUMSKINSOUNDS; j++)
			sndlumps[j] = -1;
		skins[i].namespc = Wads.GetLumpNamespace (base);

		FScanner sc(base);
		intname = 0;
		crouchname = 0;

		remove = false;
		basetype = NULL;
		transtype = NULL;

		// Data is stored as "key = data".
		while (sc.GetString ())
		{
			strncpy (key, sc.String, sizeof(key)-1);
			if (!sc.GetString() || sc.String[0] != '=')
			{
				Printf (PRINT_BOLD, "Bad format for skin %d: %s\n", (int)i, key);
				break;
			}
			sc.GetString ();
			if (0 == stricmp (key, "name"))
			{
				strncpy (skins[i].name, sc.String, 16);
				for (j = 0; (size_t)j < i; j++)
				{
					if (stricmp (skins[i].name, skins[j].name) == 0)
					{
						mysnprintf (skins[i].name, countof(skins[i].name), "skin%d", (int)i);
						Printf (PRINT_BOLD, "Skin %s duplicated as %s\n",
							skins[j].name, skins[i].name);
						break;
					}
				}
			}
			else if (0 == stricmp (key, "sprite"))
			{
				for (j = 3; j >= 0; j--)
					sc.String[j] = toupper (sc.String[j]);
				intname = *((DWORD *)sc.String);
			}
			else if (0 == stricmp (key, "crouchsprite"))
			{
				for (j = 3; j >= 0; j--)
					sc.String[j] = toupper (sc.String[j]);
				crouchname = *((DWORD *)sc.String);
			}
			else if (0 == stricmp (key, "face"))
			{
				for (j = 2; j >= 0; j--)
					skins[i].face[j] = toupper (sc.String[j]);
				skins[i].face[3] = '\0';
			}
			else if (0 == stricmp (key, "gender"))
			{
				skins[i].gender = D_GenderToInt (sc.String);
			}
			else if (0 == stricmp (key, "scale"))
			{
				skins[i].Scale.X = clamp(atof (sc.String), 1./65536, 256.);
				skins[i].Scale.Y = skins[i].Scale.X;
			}
			else if (0 == stricmp (key, "game"))
			{
				if (gameinfo.gametype == GAME_Heretic)
					basetype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_HereticPlayer));
				else if (gameinfo.gametype == GAME_Strife)
					basetype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_StrifePlayer));
				else
					basetype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_DoomPlayer));

				transtype = basetype;

				if (stricmp (sc.String, "heretic") == 0)
				{
					if (gameinfo.gametype & GAME_DoomChex)
					{
						transtype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_HereticPlayer));
						skins[i].othergame = true;
					}
					else if (gameinfo.gametype != GAME_Heretic)
					{
						remove = true;
					}
				}
				else if (stricmp (sc.String, "strife") == 0)
				{
					if (gameinfo.gametype != GAME_Strife)
					{
						remove = true;
					}
				}
				else
				{
					if (gameinfo.gametype == GAME_Heretic)
					{
						transtype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_DoomPlayer));
						skins[i].othergame = true;
					}
					else if (!(gameinfo.gametype & GAME_DoomChex))
					{
						remove = true;
					}
				}

				if (remove)
					break;
			}
			else if (0 == stricmp (key, "class"))
			{ // [GRB] Define the skin for a specific player class
				int pclass = D_PlayerClassToInt (sc.String);

				if (pclass < 0)
				{
					remove = true;
					break;
				}

				basetype = transtype = PlayerClasses[pclass].Type;
			}
			else if (key[0] == '*')
			{ // Player sound replacment (ZDoom extension)
				int lump = Wads.CheckNumForName (sc.String, skins[i].namespc);
				if (lump == -1)
				{
					lump = Wads.CheckNumForFullName (sc.String, true, ns_sounds);
				}
				if (lump != -1)
				{
					if (stricmp (key, "*pain") == 0)
					{ // Replace all pain sounds in one go
						aliasid = S_AddPlayerSound (skins[i].name, skins[i].gender,
							playersoundrefs[0], lump, true);
						for (int l = 3; l > 0; --l)
						{
							S_AddPlayerSoundExisting (skins[i].name, skins[i].gender,
								playersoundrefs[l], aliasid, true);
						}
					}
					else
					{
						int sndref = S_FindSoundNoHash (key);
						if (sndref != 0)
						{
							S_AddPlayerSound (skins[i].name, skins[i].gender, sndref, lump, true);
						}
					}
				}
			}
			else
			{
				for (j = 0; j < NUMSKINSOUNDS; j++)
				{
					if (stricmp (key, skinsoundnames[j][0]) == 0)
					{
						sndlumps[j] = Wads.CheckNumForName (sc.String, skins[i].namespc);
						if (sndlumps[j] == -1)
						{ // Replacement not found, try finding it in the global namespace
							sndlumps[j] = Wads.CheckNumForFullName (sc.String, true, ns_sounds);
						}
					}
				}
				//if (j == 8)
				//	Printf ("Funny info for skin %i: %s = %s\n", i, key, sc.String);
			}
		}

		// [GRB] Assume Doom skin by default
		if (!remove && basetype == NULL)
		{
			if (gameinfo.gametype & GAME_DoomChex)
			{
				basetype = transtype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_DoomPlayer));
			}
			else if (gameinfo.gametype == GAME_Heretic)
			{
				basetype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_HereticPlayer));
				transtype = dyn_cast<PClassPlayerPawn>(PClass::FindActor(NAME_DoomPlayer));
				skins[i].othergame = true;
			}
			else
			{
				remove = true;
			}
		}

		if (!remove)
		{
			skins[i].range0start = transtype->ColorRangeStart;
			skins[i].range0end = transtype->ColorRangeEnd;

			remove = true;
			for (j = 0; j < (int)PlayerClasses.Size (); j++)
			{
				PClassPlayerPawn *type = PlayerClasses[j].Type;

				if (type->IsDescendantOf (basetype) &&
					GetDefaultByType(type)->SpawnState->sprite == GetDefaultByType(basetype)->SpawnState->sprite &&
					type->ColorRangeStart == basetype->ColorRangeStart &&
					type->ColorRangeEnd == basetype->ColorRangeEnd)
				{
					PlayerClasses[j].Skins.Push ((int)i);
					remove = false;
				}
			}
		}

		if (!remove)
		{
			if (skins[i].name[0] == 0)
				mysnprintf (skins[i].name, countof(skins[i].name), "skin%d", (int)i);

			// Now collect the sprite frames for this skin. If the sprite name was not
			// specified, use whatever immediately follows the specifier lump.
			if (intname == 0)
			{
				char name[9];
				Wads.GetLumpName (name, base+1);
				memcpy(&intname, name, 4);
			}

			int basens = Wads.GetLumpNamespace(base);

			for(int spr = 0; spr<2; spr++)
			{
				spriteframewithrotate sprtemp[MAX_SPRITE_FRAMES];
				memset (sprtemp, 0xFFFF, sizeof(sprtemp));
				for (k = 0; k < MAX_SPRITE_FRAMES; ++k)
				{
					sprtemp[k].Flip = 0;
					sprtemp[k].Voxel = NULL;
				}
				int maxframe = -1;

				if (spr == 1)
				{
					if (crouchname !=0 && crouchname != intname)
					{
						intname = crouchname;
					}
					else
					{
						skins[i].crouchsprite = -1;
						break;
					}
				}

				for (k = base + 1; Wads.GetLumpNamespace(k) == basens; k++)
				{
					char lname[9];
					DWORD lnameint;
					Wads.GetLumpName (lname, k);
					memcpy(&lnameint, lname, 4);
					if (lnameint == intname)
					{
						FTextureID picnum = TexMan.CreateTexture(k, FTexture::TEX_SkinSprite);
						bool res = R_InstallSpriteLump (picnum, lname[4] - 'A', lname[5], false, sprtemp, maxframe);

						if (lname[6] && res)
							R_InstallSpriteLump (picnum, lname[6] - 'A', lname[7], true, sprtemp, maxframe);
					}
				}

				if (spr == 0 && maxframe <= 0)
				{
					Printf (PRINT_BOLD, "Skin %s (#%d) has no frames. Removing.\n", skins[i].name, (int)i);
					remove = true;
					break;
				}

				Wads.GetLumpName (temp.name, base+1);
				temp.name[4] = 0;
				int sprno = (int)sprites.Push (temp);
				if (spr==0)	skins[i].sprite = sprno;
				else skins[i].crouchsprite = sprno;
				R_InstallSprite (sprno, sprtemp, maxframe);
			}
		}

		if (remove)
		{
			if (i < numskins-1)
				memmove (&skins[i], &skins[i+1], sizeof(skins[0])*(numskins-i-1));
			i--;
			continue;
		}

		// Register any sounds this skin provides
		aliasid = 0;
		for (j = 0; j < NUMSKINSOUNDS; j++)
		{
			if (sndlumps[j] != -1)
			{
				if (j == 0 || sndlumps[j] != sndlumps[j-1])
				{
					aliasid = S_AddPlayerSound (skins[i].name, skins[i].gender,
						playersoundrefs[j], sndlumps[j], true);
				}
				else
				{
					S_AddPlayerSoundExisting (skins[i].name, skins[i].gender,
						playersoundrefs[j], aliasid, true);
				}
			}
		}

		// Make sure face prefix is a full 3 chars
		if (skins[i].face[1] == 0 || skins[i].face[2] == 0)
		{
			skins[i].face[0] = 0;
		}
	}

	if (numskins > PlayerClasses.Size ())
	{ // The sound table may have changed, so rehash it.
		S_HashSounds ();
		S_ShrinkPlayerSoundLists ();
	}
}